

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O1

json __thiscall
TestServerConnector::VerifyMethodResult(TestServerConnector *this,json *id,json *result)

{
  code *pcVar1;
  bool bVar2;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  reference other;
  json_value extraout_RDX;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar3;
  json jVar4;
  ResultBuilder DOCTEST_RB;
  const_iterator local_190;
  ExpressionDecomposer local_16c;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  Result local_128;
  ResultBuilder local_108;
  ulong local_78;
  const_iterator local_70;
  const_iterator local_50;
  
  doctest::String::String((String *)&local_190,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_108,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x19,"!has_key(result, \"error\")","",(String *)&local_190);
  doctest::String::~String((String *)&local_190);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_148,DT_REQUIRE);
  local_168._0_8_ = local_168 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"error","");
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::find<std::__cxx11::string_const&>
            (&local_70,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)result,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend(&local_50,result);
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    (&local_70,&local_50);
  local_128._0_8_ = (ulong)bVar2 | (long)local_148._M_dataplus._M_p << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result
            ((Result *)&local_190,(Expression_lhs *)&local_128);
  doctest::detail::ResultBuilder::setResult(&local_108,(Result *)&local_190);
  doctest::String::~String((String *)&local_190.m_it);
  dVar3 = extraout_XMM0_Qa;
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_,local_158._M_allocated_capacity + 1);
    dVar3 = extraout_XMM0_Qa_00;
  }
  doctest::detail::ResultBuilder::log(&local_108,dVar3);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    jVar4 = (json)(*pcVar1)();
    return jVar4;
  }
  doctest::detail::ResultBuilder::react(&local_108);
  doctest::String::~String((String *)&local_108.super_AssertData.m_exception_string);
  doctest::String::~String(&local_108.super_AssertData.m_decomp);
  doctest::String::~String(&local_108.super_AssertData.m_exception);
  doctest::String::String((String *)&local_190,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_108,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1a,"result[\"jsonrpc\"] == \"2.0\"","",(String *)&local_190);
  doctest::String::~String((String *)&local_190);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_128,DT_REQUIRE);
  local_168._0_8_ =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   *)result,"jsonrpc");
  local_168._8_4_ = local_128._0_4_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==((Result *)&local_190,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)local_168,(char (*) [4])"2.0");
  doctest::detail::ResultBuilder::setResult(&local_108,(Result *)&local_190);
  doctest::String::~String((String *)&local_190.m_it);
  doctest::detail::ResultBuilder::log(&local_108,__x);
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    jVar4 = (json)(*pcVar1)();
    return jVar4;
  }
  doctest::detail::ResultBuilder::react(&local_108);
  doctest::String::~String((String *)&local_108.super_AssertData.m_exception_string);
  doctest::String::~String(&local_108.super_AssertData.m_decomp);
  doctest::String::~String(&local_108.super_AssertData.m_exception);
  doctest::String::String((String *)&local_190,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_108,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1b,"result[\"id\"] == id","",(String *)&local_190);
  doctest::String::~String((String *)&local_190);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_128,DT_REQUIRE);
  local_168._0_8_ =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   *)result,"id");
  local_168._8_4_ = local_128._0_4_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==((Result *)&local_190,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)local_168,id);
  doctest::detail::ResultBuilder::setResult(&local_108,(Result *)&local_190);
  doctest::String::~String((String *)&local_190.m_it);
  doctest::detail::ResultBuilder::log(&local_108,__x_00);
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    jVar4 = (json)(*pcVar1)();
    return jVar4;
  }
  doctest::detail::ResultBuilder::react(&local_108);
  doctest::String::~String((String *)&local_108.super_AssertData.m_exception_string);
  doctest::String::~String(&local_108.super_AssertData.m_decomp);
  doctest::String::~String(&local_108.super_AssertData.m_exception);
  doctest::String::String((String *)&local_190,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_108,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1c,"has_key(result, \"result\")","",(String *)&local_190);
  doctest::String::~String((String *)&local_190);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_16c,DT_REQUIRE);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::find<std::__cxx11::string_const&>
            (&local_190,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)result,&local_148);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend((const_iterator *)local_168,result);
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    (&local_190,(const_iterator *)local_168);
  local_78 = (ulong)!bVar2 | (ulong)local_16c.m_at << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_128,(Expression_lhs *)&local_78);
  doctest::detail::ResultBuilder::setResult(&local_108,&local_128);
  doctest::String::~String(&local_128.m_decomp);
  dVar3 = extraout_XMM0_Qa_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    dVar3 = extraout_XMM0_Qa_02;
  }
  doctest::detail::ResultBuilder::log(&local_108,dVar3);
  if (extraout_AL_02 != '\0') {
    pcVar1 = (code *)swi(3);
    jVar4 = (json)(*pcVar1)();
    return jVar4;
  }
  doctest::detail::ResultBuilder::react(&local_108);
  doctest::String::~String((String *)&local_108.super_AssertData.m_exception_string);
  doctest::String::~String(&local_108.super_AssertData.m_decomp);
  doctest::String::~String(&local_108.super_AssertData.m_exception);
  other = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::operator[]<char_const>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)result,"result");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this,other);
  jVar4.m_value.object = extraout_RDX.object;
  jVar4._0_8_ = this;
  return jVar4;
}

Assistant:

static json VerifyMethodResult(const json &id, json &result) {
        REQUIRE(!has_key(result, "error"));
        REQUIRE(result["jsonrpc"] == "2.0");
        REQUIRE(result["id"] == id);
        REQUIRE(has_key(result, "result"));
        return result["result"];
    }